

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkForeachIteratorCapturedByClosure
          (CheckerVisitor *this,Id *id,ValueRef *v)

{
  FunctionDecl *pFVar1;
  int iVar2;
  bool bVar3;
  TreeOp TVar4;
  size_type sVar5;
  reference pvVar6;
  Expr *this_00;
  CallExpr *this_01;
  ArenaVector<SQCompilation::Expr_*> *this_02;
  const_iterator ppEVar7;
  DeclExpr *this_03;
  FunctionDecl *pFVar8;
  Node *pNVar9;
  Id *this_04;
  GetFieldExpr *this_05;
  long *in_RDX;
  Id *in_RSI;
  CheckerVisitor *in_RDI;
  SQChar *name;
  Expr *callee;
  Expr *arg;
  const_iterator __end3;
  const_iterator __begin3;
  ArenaVector<SQCompilation::Expr_*> *__range3;
  bool found;
  CallExpr *call;
  value_type *candidate;
  value_type *m;
  reverse_iterator rie;
  reverse_iterator rit;
  int32_t thisId;
  int32_t i;
  FunctionDecl *thisScopeOwner;
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  *in_stack_ffffffffffffff78;
  SQChar *pSVar10;
  const_iterator local_68;
  int local_24;
  
  if ((((in_RDI->effectsOnly & 1U) == 0) && (*(int *)(*in_RDX + 8) == 10)) &&
     (pFVar1 = in_RDI->currentScope->owner,
     *(FunctionDecl **)(*(long *)(*in_RDX + 0x10) + 8) != in_RDI->currentScope->owner)) {
    sVar5 = std::
            vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
            ::size(&in_RDI->nodeStack);
    std::
    vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
    ::rbegin(in_stack_ffffffffffffff78);
    std::
    vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
    ::rend(in_stack_ffffffffffffff78);
    local_24 = (int)sVar5;
    do {
      iVar2 = local_24;
      local_24 = iVar2 + -1;
      if (local_24 < 0) break;
      pvVar6 = std::
               vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
               ::operator[](&in_RDI->nodeStack,(long)local_24);
    } while ((pvVar6->sst != SST_NODE) || ((FunctionDecl *)(pvVar6->field_1).n != pFVar1));
    if ((2 < local_24) &&
       ((pvVar6 = std::
                  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                  ::operator[](&in_RDI->nodeStack,(long)(iVar2 + -3)), pvVar6->sst == SST_NODE &&
        (TVar4 = Node::op((pvVar6->field_1).n), TVar4 == TO_CALL)))) {
      this_00 = Node::asExpression((pvVar6->field_1).n);
      this_01 = Expr::asCallExpr(this_00);
      bVar3 = false;
      this_02 = CallExpr::arguments(this_01);
      local_68 = ArenaVector<SQCompilation::Expr_*>::begin(this_02);
      ppEVar7 = ArenaVector<SQCompilation::Expr_*>::end(this_02);
      for (; local_68 != ppEVar7; local_68 = local_68 + 1) {
        pNVar9 = &(*local_68)->super_Node;
        TVar4 = Node::op(pNVar9);
        if (TVar4 == TO_DECL_EXPR) {
          this_03 = Expr::asDeclExpr((Expr *)pNVar9);
          pFVar8 = (FunctionDecl *)DeclExpr::declaration(this_03);
          if (pFVar8 == pFVar1) {
            bVar3 = true;
            break;
          }
        }
      }
      if (bVar3) {
        pNVar9 = &CallExpr::callee(this_01)->super_Node;
        pSVar10 = (SQChar *)0x0;
        TVar4 = Node::op(pNVar9);
        if (TVar4 == TO_ID) {
          this_04 = Node::asId(pNVar9);
          pSVar10 = Id::id(this_04);
        }
        else {
          TVar4 = Node::op(pNVar9);
          if (TVar4 == TO_GETFIELD) {
            this_05 = Node::asGetField(pNVar9);
            pSVar10 = FieldAccessExpr::fieldName(&this_05->super_FieldAccessExpr);
          }
        }
        if ((pSVar10 != (SQChar *)0x0) &&
           (bVar3 = nameLooksLikeCallsLambdaInPlace((SQChar *)0x187b13), bVar3)) {
          return;
        }
      }
    }
    pSVar10 = Id::id(in_RSI);
    report(in_RDI,(Node *)in_RSI,0x71,pSVar10);
  }
  return;
}

Assistant:

void CheckerVisitor::checkForeachIteratorCapturedByClosure(const Id *id, const ValueRef *v) {
  if (effectsOnly)
    return;

  if (v->info->kind != SK_FOREACH)
    return;

  const FunctionDecl *thisScopeOwner = currentScope->owner;

  if (v->info->ownedScope->owner == currentScope->owner)
    return;

  int32_t i = nodeStack.size() - 1;
  assert(i > 0);

  int32_t thisId = -1;
  auto rit = nodeStack.rbegin();
  auto rie = nodeStack.rend();

  while (i >= 0) {
    auto &m = nodeStack[i];

    if (m.sst == SST_NODE) {
      if (m.n == thisScopeOwner) {
        thisId = i;
        break;
      }
    }
    --i;
  }

  assert(thisId > 0);

  if (i > 2) { // decl_expr + call + foreach

    auto &candidate = nodeStack[i - 2];

    if (candidate.sst == SST_NODE && candidate.n->op() == TO_CALL) {
      const CallExpr *call = candidate.n->asExpression()->asCallExpr();

      bool found = false;
      for (auto arg : call->arguments()) {
        if (arg->op() == TO_DECL_EXPR && arg->asDeclExpr()->declaration() == thisScopeOwner) {
          found = true;
          break;
        }
      }

      if (found) {// in call arguments
        const Expr *callee = call->callee();
        const SQChar *name = nullptr;

        if (callee->op() == TO_ID)
          name = callee->asId()->id();
        else if (callee->op() == TO_GETFIELD)
          name = callee->asGetField()->fieldName();

        if (name && nameLooksLikeCallsLambdaInPlace(name)) {
          return;
        }
      }
    }
  }

  report(id, DiagnosticsId::DI_ITER_IN_CLOSURE, id->id());
}